

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O0

bool P_PredictLine(line_t_conflict *line,AActor *mo,int side,int activationType)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  BYTE special;
  INTBOOL buttonSuccess;
  int lineActivation;
  int activationType_local;
  int side_local;
  AActor *mo_local;
  line_t_conflict *line_local;
  
  if ((line->special == 0xd7) || (line->special == 0x46)) {
    bVar2 = P_TestActivateLine(line,mo,side,activationType,(DVector3 *)0x0);
    if ((bVar2) && (bVar2 = FBoolCVar::operator_cast_to_bool(&cl_predict_specials), bVar2)) {
      if (line->locknumber < 1) {
        iVar3 = P_ExecuteSpecial(line->special,(line_t *)line,mo,side == 1,line->args[0],
                                 line->args[1],line->args[2],line->args[3],line->args[4]);
        iVar1 = line->special;
        iVar4 = FIntCVar::operator_cast_to_int(&developer);
        if ((3 < iVar4) && (iVar3 != 0)) {
          Printf("Line special %d predicted on line %i\n",(ulong)(byte)iVar1,
                 ((long)line - (long)lines) / 0x98 & 0xffffffff);
        }
        line_local._7_1_ = true;
      }
      else {
        line_local._7_1_ = false;
      }
    }
    else {
      line_local._7_1_ = false;
    }
  }
  else {
    line_local._7_1_ = false;
  }
  return line_local._7_1_;
}

Assistant:

bool P_PredictLine(line_t *line, AActor *mo, int side, int activationType)
{
	int lineActivation;
	INTBOOL buttonSuccess;
	BYTE special;

	// Only predict a very specifc section of specials
	if (line->special != Teleport_Line &&
		line->special != Teleport)
	{
		return false;
	}

	if (!P_TestActivateLine(line, mo, side, activationType) || !cl_predict_specials)
	{
		return false;
	}

	if (line->locknumber > 0) return false;
	lineActivation = line->activation;
	buttonSuccess = false;
	buttonSuccess = P_ExecuteSpecial(line->special,
		line, mo, side == 1, line->args[0],
		line->args[1], line->args[2],
		line->args[3], line->args[4]);

	special = line->special;

	// end of changed code
	if (developer >= DMSG_SPAMMY && buttonSuccess)
	{
		Printf("Line special %d predicted on line %i\n", special, int(line - lines));
	}
	return true;
}